

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_profiler.c
# Opt level: O2

SUNErrCode SUNProfiler_Print(SUNProfiler p,FILE *fp)

{
  SUNHashMapKeyValue pSVar1;
  char *__s1;
  void *pvVar2;
  SUNErrCode SVar3;
  int iVar4;
  int64_t iVar5;
  int64_t i;
  long lVar6;
  SUNProfiler p_1;
  double dVar7;
  SUNHashMapKeyValue *sorted;
  sunTimerStruct *timer;
  double local_48;
  undefined8 local_40;
  double resolution;
  
  timer = (sunTimerStruct *)0x0;
  sorted = (SUNHashMapKeyValue *)0x0;
  if (p == (SUNProfiler)0x0) {
    SVar3 = -9999;
  }
  else {
    sunStartTiming(p->overhead);
    iVar5 = SUNHashMap_GetValue(p->map,"From profiler epoch",&timer);
    if (iVar5 == -99) {
      SVar3 = -0x26fd;
    }
    else if (iVar5 == -1) {
      SVar3 = -0x26fb;
    }
    else {
      p->sundials_time = timer->elapsed;
      SVar3 = SUNHashMap_Sort(p->map,&sorted,sunCompareTimes);
      if (SVar3 == 0) {
        SUNProfiler_GetTimerResolution(p,&resolution);
        fwrite("\n================================================================================================================\n"
               ,0x72,1,(FILE *)fp);
        lVar6 = 0;
        fprintf((FILE *)fp,"SUNDIALS GIT VERSION: %s\n","v7.3.0");
        fprintf((FILE *)fp,"SUNDIALS PROFILER: %s\n",p->title);
        fprintf((FILE *)fp,"TIMER RESOLUTION: %gs\n",resolution);
        fprintf((FILE *)fp,"%-40s\t %% time (inclusive) \t max/rank \t average/rank \t count \n",
                "RESULTS:");
        fwrite("================================================================================================================\n"
               ,0x71,1,(FILE *)fp);
        while( true ) {
          iVar5 = SUNHashMap_Capacity(p->map);
          if (iVar5 <= lVar6) break;
          pSVar1 = sorted[lVar6];
          if (pSVar1 != (SUNHashMapKeyValue)0x0) {
            __s1 = pSVar1->key;
            pvVar2 = pSVar1->value;
            local_40 = *(undefined8 *)((long)pvVar2 + 0x10);
            local_48 = *(double *)((long)pvVar2 + 0x18);
            iVar4 = strcmp(__s1,"From profiler epoch");
            dVar7 = 100.0;
            if (iVar4 != 0) {
              dVar7 = (local_48 / p->sundials_time) * 100.0;
            }
            fprintf((FILE *)fp,"%-40s\t %6.2f%% \t         %.6fs \t %.6fs \t %ld\n",dVar7,local_48,
                    local_40,__s1,*(undefined8 *)((long)pvVar2 + 0x28));
          }
          lVar6 = lVar6 + 1;
        }
        free(sorted);
        sunStopTiming(p->overhead);
        fprintf((FILE *)fp,"%-40s\t %6.2f%% \t         %.6fs \t -- \t\t -- \n",
                p->overhead->elapsed / p->sundials_time,"Est. profiler overhead");
        fputc(10,(FILE *)fp);
        SVar3 = 0;
      }
      else {
        SVar3 = -0x26fa;
      }
    }
  }
  return SVar3;
}

Assistant:

SUNErrCode SUNProfiler_Print(SUNProfiler p, FILE* fp)
{
  int64_t ier                = 0;
  int rank                   = 0;
  sunTimerStruct* timer      = NULL;
  SUNHashMapKeyValue* sorted = NULL;

  if (!p) { return SUN_ERR_ARG_CORRUPT; }

  sunStartTiming(p->overhead);

  /* Get the total SUNDIALS time up to this point */
  SUNDIALS_MARK_END(p, SUNDIALS_ROOT_TIMER);
  SUNDIALS_MARK_BEGIN(p, SUNDIALS_ROOT_TIMER);

  ier = SUNHashMap_GetValue(p->map, SUNDIALS_ROOT_TIMER, (void**)&timer);
  if (ier == SUNHASHMAP_ERROR) { return SUN_ERR_PROFILER_MAPGET; }
  if (ier == SUNHASHMAP_KEYNOTFOUND) { return SUN_ERR_PROFILER_MAPKEYNOTFOUND; }
  p->sundials_time = timer->elapsed;

#if SUNDIALS_MPI_ENABLED
  if (p->comm != SUN_COMM_NULL)
  {
    MPI_Comm_rank(p->comm, &rank);
    /* Find the max and average time across all ranks */
    sunCollectTimers(p);
  }
#endif

  if (rank == 0)
  {
    double resolution;
    /* Sort the timers in descending order */
    if (SUNHashMap_Sort(p->map, &sorted, sunCompareTimes))
    {
      return SUN_ERR_PROFILER_MAPSORT;
    }
    SUNProfiler_GetTimerResolution(p, &resolution);
    fprintf(fp, "\n============================================================"
                "====================================================\n");
    fprintf(fp, "SUNDIALS GIT VERSION: %s\n", SUNDIALS_GIT_VERSION);
    fprintf(fp, "SUNDIALS PROFILER: %s\n", p->title);
    fprintf(fp, "TIMER RESOLUTION: %gs\n", resolution);
    fprintf(fp, "%-40s\t %% time (inclusive) \t max/rank \t average/rank \t count \n",
            "RESULTS:");
    fprintf(fp, "=============================================================="
                "==================================================\n");

#if SUNDIALS_MPI_ENABLED
    if (p->comm == SUN_COMM_NULL)
    {
      printf(
        "WARNING: no MPI communicator provided, times shown are for rank 0\n");
    }
#endif

    /* Print all the other timers out */
    for (int64_t i = 0; i < SUNHashMap_Capacity(p->map); i++)
    {
      if (sorted[i]) { sunPrintTimer(sorted[i], fp, (void*)p); }
    }
    free(sorted);
  }

  sunStopTiming(p->overhead);

  if (rank == 0)
  {
    /* Print out the total time and the profiler overhead */
    fprintf(fp, "%-40s\t %6.2f%% \t         %.6fs \t -- \t\t -- \n",
            "Est. profiler overhead", p->overhead->elapsed / p->sundials_time,
            p->overhead->elapsed);

    /* End of output */
    fprintf(fp, "\n");
  }

  return SUN_SUCCESS;
}